

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex.c
# Opt level: O1

void hexUpper(char *hex)

{
  byte bVar1;
  byte bVar2;
  byte *pbVar3;
  
  bVar2 = *hex;
  if (bVar2 != 0) {
    pbVar3 = (byte *)(hex + 2);
    do {
      bVar1 = hex_dec_table[pbVar3[-1]];
      pbVar3[-2] = "0123456789ABCDEF"[(byte)(hex_dec_table[bVar2] << 4 | bVar1) >> 4];
      pbVar3[-1] = "0123456789ABCDEF"[bVar1 & 0xf];
      bVar2 = *pbVar3;
      pbVar3 = pbVar3 + 2;
    } while (bVar2 != 0);
  }
  return;
}

Assistant:

void hexUpper(char* hex)
{
	ASSERT(hexIsValid(hex));
	for (; *hex; hex += 2)
		hexFromOUpper(hex, hexToO(hex));
}